

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

BlendEquation sglr::rr_util::mapGLBlendEquation(deUint32 equation)

{
  BlendEquation local_c;
  deUint32 equation_local;
  
  switch(equation) {
  case 0x8006:
    local_c = BLENDEQUATION_ADD;
    break;
  case 0x8007:
    local_c = BLENDEQUATION_MIN;
    break;
  case 0x8008:
    local_c = BLENDEQUATION_MAX;
    break;
  default:
    local_c = BLENDEQUATION_LAST;
    break;
  case 0x800a:
    local_c = BLENDEQUATION_SUBTRACT;
    break;
  case 0x800b:
    local_c = BLENDEQUATION_REVERSE_SUBTRACT;
  }
  return local_c;
}

Assistant:

rr::BlendEquation mapGLBlendEquation (deUint32 equation)
{
	switch (equation)
	{
		case GL_FUNC_ADD:				return rr::BLENDEQUATION_ADD;
		case GL_FUNC_SUBTRACT:			return rr::BLENDEQUATION_SUBTRACT;
		case GL_FUNC_REVERSE_SUBTRACT:	return rr::BLENDEQUATION_REVERSE_SUBTRACT;
		case GL_MIN:					return rr::BLENDEQUATION_MIN;
		case GL_MAX:					return rr::BLENDEQUATION_MAX;
		default:
			DE_ASSERT(false);
			return rr::BLENDEQUATION_LAST;
	}
}